

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_data.cpp
# Opt level: O2

double Get_CPU_Load(void)

{
  bool bVar1;
  unique_lock<std::timed_mutex> cpu_load_lock;
  double local_28;
  unique_lock<std::timed_mutex> local_20;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  local_20._M_device = &CPU_Load_Mutex;
  local_20._M_owns = false;
  local_10.__r = 5;
  bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    (&local_20,&local_10);
  local_28 = 0.0;
  if (bVar1) {
    local_28 = CPU_Load;
    std::unique_lock<std::timed_mutex>::unlock(&local_20);
  }
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_20);
  return local_28;
}

Assistant:

bool Get_Run()
{
    return Run;
}